

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_list.cpp
# Opt level: O1

bool __thiscall
libtorrent::aux::peer_list::new_connection
          (peer_list *this,peer_connection_interface *c,int session_time,torrent_state *state)

{
  short sVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  _Map_pointer ppptVar5;
  error_category *peVar6;
  error_category *peVar7;
  uchar auVar8 [8];
  _Elt_pointer pptVar9;
  _func_int **pp_Var10;
  anon_union_16_3_a3f0114d_for___in6_u aVar11;
  undefined1 *puVar12;
  undefined8 uVar13;
  bool bVar14;
  int iVar15;
  int iVar16;
  undefined4 extraout_var;
  short *psVar17;
  size_t sVar18;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  torrent_peer *this_00;
  undefined4 extraout_var_04;
  ipv6_peer *piVar19;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined4 extraout_var_13;
  long lVar20;
  char *pcVar21;
  address *addr_00;
  address *addr_01;
  ushort uVar22;
  peer_connection_interface *ppVar23;
  torrent_state *ptVar24;
  ushort uVar25;
  _Elt_pointer pptVar26;
  char *pcVar27;
  bool bVar28;
  undefined1 auVar29 [16];
  string_view sVar30;
  match_peer_endpoint __pred;
  address addr;
  string i2p_dest;
  pair<std::_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>,_std::_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>_>
  range;
  _Elt_pointer local_180;
  undefined1 local_178 [8];
  undefined1 auStack_170 [16];
  error_category *peStack_160;
  uchar local_158 [8];
  _Elt_pointer local_150;
  uchar local_148 [8];
  torrent_state *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_118 [32];
  undefined1 local_f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  _Elt_pointer local_d8;
  _Elt_pointer pptStack_d0;
  _Elt_pointer local_c8;
  _Map_pointer ppptStack_c0;
  long local_b8;
  undefined1 local_b0 [16];
  ulong local_a0;
  int local_94;
  const_iterator local_90;
  _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
  local_70;
  _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
  local_50;
  undefined4 extraout_var_00;
  undefined4 extraout_var_05;
  undefined4 extraout_var_12;
  
  local_94 = session_time;
  iVar15 = (**c->_vptr_peer_connection_interface)(c);
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  lVar20 = *(long *)CONCAT44(extraout_var,iVar15);
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_138,lVar20,((long *)CONCAT44(extraout_var,iVar15))[1] + lVar20);
  if ((state->allow_multiple_connections_per_ip == true) && (local_138._M_string_length == 0)) {
    iVar15 = (*c->_vptr_peer_connection_interface[2])(c);
    psVar17 = (short *)CONCAT44(extraout_var_00,iVar15);
    if (*psVar17 == 2) {
      local_178 = (undefined1  [8])((ulong)*(uint *)(psVar17 + 2) << 0x20);
      auStack_170 = (undefined1  [16])0x0;
      peStack_160 = (error_category *)0x0;
    }
    else {
      auStack_170 = *(undefined1 (*) [16])(psVar17 + 4);
      peStack_160 = (error_category *)(ulong)*(uint *)(psVar17 + 0xc);
      local_178 = (undefined1  [8])0x1;
    }
    find_peers((pair<std::_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>,_std::_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>_>
                *)local_f8,this,(address *)local_178);
    local_50._M_cur = (_Elt_pointer)local_f8._0_8_;
    local_50._M_first = (_Elt_pointer)local_f8._8_8_;
    local_50._M_last = (_Elt_pointer)local_e8._M_allocated_capacity;
    local_50._M_node = (_Map_pointer)local_e8._8_8_;
    local_70._M_cur = local_d8;
    local_70._M_first = pptStack_d0;
    local_70._M_last = local_c8;
    local_70._M_node = ppptStack_c0;
    __pred.m_port = psVar17[1] << 8 | (ushort)psVar17[1] >> 8;
    __pred.m_addr = (address *)local_178;
    __pred._10_6_ = 0;
    ::std::
    find_if<std::_Deque_iterator<libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_peer*&,libtorrent::aux::torrent_peer**>,(anonymous_namespace)::match_peer_endpoint>
              ((_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
                *)local_118,&local_50,&local_70,__pred);
    local_180 = (_Elt_pointer)local_118._16_8_;
    bVar28 = (_Elt_pointer)local_118._0_8_ != local_d8;
    ptVar24 = (torrent_state *)local_118._8_8_;
    pptVar26 = (_Elt_pointer)local_118._0_8_;
LAB_0028a85c:
    if (!bVar28) goto LAB_0028aa27;
    this_00 = *pptVar26;
    if ((this_00->connection != (peer_connection_interface *)0x0) &&
       (iVar15 = (*c->_vptr_peer_connection_interface[0x11])(c,4), (char)iVar15 != '\0')) {
      if (local_138._M_string_length == 0) {
        iVar15 = (*c->_vptr_peer_connection_interface[2])(c);
        psVar17 = (short *)CONCAT44(extraout_var_08,iVar15);
        if (*psVar17 == 2) {
          local_178 = (undefined1  [8])((ulong)*(uint *)(psVar17 + 2) << 0x20);
          auStack_170 = (undefined1  [16])0x0;
          peStack_160 = (error_category *)0x0;
        }
        else {
          auStack_170 = *(undefined1 (*) [16])(psVar17 + 4);
          peStack_160 = (error_category *)(ulong)*(uint *)(psVar17 + 0xc);
          local_178 = (undefined1  [8])0x1;
        }
        print_address_abi_cxx11_((string *)local_f8,(aux *)local_178,addr_00);
        uVar13 = local_f8._0_8_;
        torrent_peer::address(this_00);
        print_address_abi_cxx11_((string *)local_118,(aux *)&local_b8,addr_01);
        (*c->_vptr_peer_connection_interface[0x12])
                  (c,4,"DUPLICATE PEER","this: \"%s\" that: \"%s\"",uVar13,local_118._0_8_);
        if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
          operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._0_8_ != &local_e8) {
          operator_delete((void *)local_f8._0_8_,local_e8._M_allocated_capacity + 1);
        }
      }
      else {
        (*c->_vptr_peer_connection_interface[0x12])
                  (c,4,"DUPLICATE PEER","destination: \"%s\"",local_138._M_dataplus._M_p);
      }
    }
    if ((this_00->field_0x1e & 8) != 0) {
      local_f8 = (undefined1  [16])errors::make_error_code(peer_banned);
      (*c->_vptr_peer_connection_interface[4])(c,local_f8,1,0);
LAB_0028b413:
      bVar28 = false;
      goto LAB_0028b415;
    }
    if (this_00->connection == (peer_connection_interface *)0x0) goto LAB_0028ac8d;
    pp_Var10 = this_00->connection->_vptr_peer_connection_interface;
    if (local_138._M_string_length == 0) {
      iVar15 = (*pp_Var10[2])();
      (*c->_vptr_peer_connection_interface[3])(local_f8,c);
      bVar14 = boost::asio::ip::operator==
                         ((basic_endpoint<boost::asio::ip::tcp> *)CONCAT44(extraout_var_10,iVar15),
                          (basic_endpoint<boost::asio::ip::tcp> *)local_f8);
      bVar28 = true;
      if (!bVar14) {
        (*this_00->connection->_vptr_peer_connection_interface[3])(local_178);
        iVar15 = (*c->_vptr_peer_connection_interface[2])(c);
        bVar28 = boost::asio::ip::operator==
                           ((basic_endpoint<boost::asio::ip::tcp> *)local_178,
                            (basic_endpoint<boost::asio::ip::tcp> *)CONCAT44(extraout_var_11,iVar15)
                           );
      }
LAB_0028b03c:
      if (bVar28 != false) {
LAB_0028b040:
        local_f8 = (undefined1  [16])errors::make_error_code(self_connection);
        (*c->_vptr_peer_connection_interface[4])(c,local_f8,1,1);
        ppVar23 = this_00->connection;
        local_f8 = (undefined1  [16])errors::make_error_code(self_connection);
        (*ppVar23->_vptr_peer_connection_interface[4])(ppVar23,local_f8,1,1);
        goto LAB_0028b413;
      }
    }
    else {
      iVar15 = (*pp_Var10[1])();
      sVar18 = ((undefined8 *)CONCAT44(extraout_var_09,iVar15))[1];
      if (sVar18 == local_138._M_string_length) {
        if (sVar18 != 0) {
          iVar15 = bcmp(*(void **)CONCAT44(extraout_var_09,iVar15),local_138._M_dataplus._M_p,sVar18
                       );
          bVar28 = iVar15 == 0;
          goto LAB_0028b03c;
        }
        goto LAB_0028b040;
      }
    }
    iVar15 = (*this_00->connection->_vptr_peer_connection_interface[10])();
    iVar16 = (*c->_vptr_peer_connection_interface[10])(c);
    if ((char)iVar15 == (char)iVar16) {
      local_f8 = (undefined1  [16])errors::make_error_code(duplicate_peer_id);
      (*c->_vptr_peer_connection_interface[4])(c,local_f8,1,0);
      goto LAB_0028b413;
    }
    if (local_138._M_string_length == 0) {
      iVar15 = (*c->_vptr_peer_connection_interface[10])(c);
      if ((char)iVar15 == '\0') {
        (*c->_vptr_peer_connection_interface[3])(local_178,c);
        puVar12 = local_178;
        ppVar23 = this_00->connection;
      }
      else {
        (*this_00->connection->_vptr_peer_connection_interface[3])(local_f8);
        puVar12 = local_f8;
        ppVar23 = c;
      }
      uVar2 = *(ushort *)(puVar12 + 2);
      iVar16 = (*ppVar23->_vptr_peer_connection_interface[2])();
      uVar25 = uVar2 << 8 | uVar2 >> 8;
      uVar3 = *(ushort *)(CONCAT44(extraout_var_13,iVar16) + 2);
      uVar22 = uVar3 << 8 | uVar3 >> 8;
      bVar28 = uVar25 < uVar22;
      if ((char)iVar15 != '\0') {
        bVar28 = uVar25 >= uVar22 && uVar25 != uVar22;
      }
      if (bVar28) {
        bVar28 = false;
      }
      else {
        bVar28 = true;
        if (uVar2 == uVar3) {
          lVar20 = random((aux *)0x1);
          bVar28 = (int)lVar20 == 0;
        }
      }
      iVar15 = (*this_00->connection->_vptr_peer_connection_interface[0xe])();
      iVar16 = (*c->_vptr_peer_connection_interface[0x11])(c,4);
      if ((char)iVar16 != '\0') {
        pcVar27 = "no";
        pcVar21 = "yes";
        if (bVar28 || (char)iVar15 != '\0') {
          pcVar21 = "no";
          pcVar27 = "yes";
        }
        (*c->_vptr_peer_connection_interface[0x12])
                  (c,4,"DUPLICATE_PEER_RESOLUTION","our: %d other: %d disconnecting: %s",
                   (ulong)uVar25,(ulong)(uint)uVar22,pcVar21);
        (*this_00->connection->_vptr_peer_connection_interface[0x12])
                  (this_00->connection,4,"DUPLICATE_PEER_RESOLUTION",
                   "our: %d other: %d disconnecting: %s",(ulong)uVar25,(ulong)(uint)uVar22,pcVar27);
      }
      if (!bVar28 && (char)iVar15 == '\0') {
        local_f8 = (undefined1  [16])errors::make_error_code(duplicate_peer_id);
        (*c->_vptr_peer_connection_interface[4])(c,local_f8,1,0);
        goto LAB_0028b413;
      }
      this->m_locked_peer = this_00;
      ppVar23 = this_00->connection;
      local_f8 = (undefined1  [16])errors::make_error_code(duplicate_peer_id);
      (*ppVar23->_vptr_peer_connection_interface[4])(ppVar23,local_f8,1,0);
      this->m_locked_peer = (torrent_peer *)0x0;
    }
    else {
      iVar15 = (**this_00->connection->_vptr_peer_connection_interface)();
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CONCAT44(extraout_var_12,iVar15);
      iVar15 = (*c->_vptr_peer_connection_interface[10])(c);
      if ((char)iVar15 == '\0') {
        bVar28 = false;
      }
      else {
        bVar28 = ::std::operator>(&local_138,__rhs);
      }
      iVar15 = (*c->_vptr_peer_connection_interface[0x11])(c,4);
      if ((char)iVar15 != '\0') {
        pcVar27 = "yes";
        pcVar21 = "no";
        if (bVar28 != false) {
          pcVar21 = "yes";
          pcVar27 = "no";
        }
        (*c->_vptr_peer_connection_interface[0x12])
                  (c,4,"DUPLICATE_PEER_RESOLUTION","our: %s other: %s disconnecting: %s",
                   local_138._M_dataplus._M_p,(__rhs->_M_dataplus)._M_p,pcVar21);
        (*this_00->connection->_vptr_peer_connection_interface[0x12])
                  (this_00->connection,4,"DUPLICATE_PEER_RESOLUTION",
                   "our: %s other: %s disconnecting: %s",(__rhs->_M_dataplus)._M_p,
                   local_138._M_dataplus._M_p,pcVar27);
      }
      if (bVar28 != false) {
        local_f8 = (undefined1  [16])errors::make_error_code(duplicate_peer_id);
        (*c->_vptr_peer_connection_interface[4])(c,local_f8,1,0);
        goto LAB_0028b413;
      }
      this->m_locked_peer = this_00;
      ppVar23 = this_00->connection;
      local_f8 = (undefined1  [16])errors::make_error_code(duplicate_peer_id);
      (*ppVar23->_vptr_peer_connection_interface[4])(ppVar23,local_f8,1,0);
      this->m_locked_peer = (torrent_peer *)0x0;
    }
LAB_0028ac8d:
    if ((((this_00->connection == (peer_connection_interface *)0x0) &&
         (uVar4 = *(uint *)&this_00->field_0x1b, (uVar4 & 0x88000020) == 0x20)) &&
        ((-1 < (char)uVar4 || (-1 < *(int *)&this->field_0x60)))) &&
       ((int)(uVar4 & 0x1f) < this->m_max_failcount)) {
      iVar15 = 1;
      if (1 < this->m_num_connect_candidates) {
        iVar15 = this->m_num_connect_candidates;
      }
      this->m_num_connect_candidates = iVar15 + -1;
    }
  }
  else {
    if (local_138._M_string_length == 0) {
      pptVar26 = (this->m_peers).
                 super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 .
                 super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
      local_148 = (uchar  [8])
                  (this->m_peers).
                  super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                  .
                  super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_first;
      local_150 = (this->m_peers).
                  super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                  .
                  super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_last;
      local_158 = (uchar  [8])
                  (this->m_peers).
                  super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                  .
                  super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node;
      piVar19 = (ipv6_peer *)
                (this->m_peers).
                super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                .
                super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      aVar11 = *(anon_union_16_3_a3f0114d_for___in6_u *)
                &(this->m_peers).
                 super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 .
                 super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_first;
      peVar6 = (error_category *)
               (this->m_peers).
               super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               .
               super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node;
      local_140 = state;
      iVar15 = (*c->_vptr_peer_connection_interface[2])(c);
      psVar17 = (short *)CONCAT44(extraout_var_01,iVar15);
      if (*psVar17 == 2) {
        local_b8 = (ulong)*(uint *)(psVar17 + 2) << 0x20;
        local_b0 = (undefined1  [16])0x0;
        local_a0 = 0;
      }
      else {
        local_b0 = *(undefined1 (*) [16])(psVar17 + 4);
        local_a0 = (ulong)*(uint *)(psVar17 + 0xc);
        local_b8 = 1;
      }
      local_f8[8] = local_148[0];
      local_f8[9] = local_148[1];
      local_f8[10] = local_148[2];
      local_f8[0xb] = local_148[3];
      local_f8[0xc] = local_148[4];
      local_f8[0xd] = local_148[5];
      local_f8[0xe] = local_148[6];
      local_f8[0xf] = local_148[7];
      local_f8._0_8_ = pptVar26;
      local_e8._M_allocated_capacity = (size_type)local_150;
      local_e8._M_local_buf[8] = local_158[0];
      local_e8._M_local_buf[9] = local_158[1];
      local_e8._M_local_buf[10] = local_158[2];
      local_e8._M_local_buf[0xb] = local_158[3];
      local_e8._M_local_buf[0xc] = local_158[4];
      local_e8._M_local_buf[0xd] = local_158[5];
      local_e8._M_local_buf[0xe] = local_158[6];
      local_e8._M_local_buf[0xf] = local_158[7];
      local_178 = (undefined1  [8])piVar19;
      auStack_170 = (undefined1  [16])aVar11;
      peStack_160 = peVar6;
      ::std::
      __lower_bound<std::_Deque_iterator<libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_peer*&,libtorrent::aux::torrent_peer**>,boost::asio::ip::address,__gnu_cxx::__ops::_Iter_comp_val<libtorrent::aux::peer_address_compare>>
                (local_118);
      ptVar24 = (torrent_state *)local_118._8_8_;
      pptVar26 = (_Elt_pointer)local_118._0_8_;
      state = local_140;
      local_180 = (_Elt_pointer)local_118._16_8_;
      if ((_Elt_pointer)local_118._0_8_ !=
          (this->m_peers).
          super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
          .
          super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
        torrent_peer::address(*(torrent_peer **)local_118._0_8_);
        iVar15 = (*c->_vptr_peer_connection_interface[2])(c);
        psVar17 = (short *)CONCAT44(extraout_var_02,iVar15);
        if (*psVar17 == 2) {
          local_178 = (undefined1  [8])((ulong)*(uint *)(psVar17 + 2) << 0x20);
          auStack_170 = (undefined1  [16])0x0;
          peStack_160 = (error_category *)0x0;
        }
        else {
          auStack_170 = *(undefined1 (*) [16])
                         ((anon_union_16_3_a3f0114d_for___in6_u *)(psVar17 + 4))->__u6_addr8;
          peStack_160 = (error_category *)(ulong)*(uint *)(psVar17 + 0xc);
          local_178 = (undefined1  [8])0x1;
        }
        if (local_f8._0_4_ != local_178._0_4_) goto LAB_0028abc7;
        if (local_f8._0_4_ == ipv6) {
          auVar29[0] = -(auStack_170[0] == local_f8[8]);
          auVar29[1] = -(auStack_170[1] == local_f8[9]);
          auVar29[2] = -(auStack_170[2] == local_f8[10]);
          auVar29[3] = -(auStack_170[3] == local_f8[0xb]);
          auVar29[4] = -(auStack_170[4] == local_f8[0xc]);
          auVar29[5] = -(auStack_170[5] == local_f8[0xd]);
          auVar29[6] = -(auStack_170[6] == local_f8[0xe]);
          auVar29[7] = -(auStack_170[7] == local_f8[0xf]);
          auVar29[8] = -(auStack_170[8] == local_e8._M_local_buf[0]);
          auVar29[9] = -(auStack_170[9] == local_e8._M_local_buf[1]);
          auVar29[10] = -(auStack_170[10] == local_e8._M_local_buf[2]);
          auVar29[0xb] = -(auStack_170[0xb] == local_e8._M_local_buf[3]);
          auVar29[0xc] = -(auStack_170[0xc] == local_e8._M_local_buf[4]);
          auVar29[0xd] = -(auStack_170[0xd] == local_e8._M_local_buf[5]);
          auVar29[0xe] = -(auStack_170[0xe] == local_e8._M_local_buf[6]);
          auVar29[0xf] = -(auStack_170[0xf] == local_e8._M_local_buf[7]);
          bVar28 = (error_category *)local_e8._8_8_ == peStack_160 &&
                   (ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe |
                           (ushort)(auVar29[0xf] >> 7) << 0xf) == 0xffff;
        }
        else {
          bVar28 = local_f8._4_4_ == local_178._4_4_;
        }
        goto LAB_0028a85c;
      }
    }
    else {
      local_f8 = *(undefined1 (*) [16])
                  &(this->m_peers).
                   super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   .
                   super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   ._M_impl.super__Deque_impl_data._M_start;
      local_e8._M_allocated_capacity =
           (size_type)
           (this->m_peers).
           super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           .
           super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
      local_e8._8_8_ =
           (this->m_peers).
           super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           .
           super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           ._M_impl.super__Deque_impl_data._M_start._M_node;
      local_178 = (undefined1  [8])
                  (this->m_peers).
                  super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                  .
                  super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      auStack_170 = *(undefined1 (*) [16])
                     &(this->m_peers).
                      super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                      .
                      super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first;
      peStack_160 = (error_category *)
                    (this->m_peers).
                    super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    .
                    super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node;
      ::std::
      __lower_bound<std::_Deque_iterator<libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_peer*&,libtorrent::aux::torrent_peer**>,std::__cxx11::string,__gnu_cxx::__ops::_Iter_comp_val<libtorrent::aux::peer_address_compare>>
                (local_118);
      ptVar24 = (torrent_state *)local_118._8_8_;
      pptVar26 = (_Elt_pointer)local_118._0_8_;
      local_180 = (_Elt_pointer)local_118._16_8_;
      if (((_Elt_pointer)local_118._0_8_ !=
           (this->m_peers).
           super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           .
           super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur) &&
         (((*(torrent_peer **)local_118._0_8_)->field_0x1e & 2) != 0)) {
        sVar30 = torrent_peer::dest(*(torrent_peer **)local_118._0_8_);
        sVar18 = sVar30._M_len;
        if (sVar18 == local_138._M_string_length) {
          if (sVar18 == 0) {
            bVar28 = true;
          }
          else {
            iVar15 = bcmp(sVar30._M_str,local_138._M_dataplus._M_p,sVar18);
            bVar28 = iVar15 == 0;
          }
        }
        else {
LAB_0028abc7:
          bVar28 = false;
        }
        goto LAB_0028a85c;
      }
    }
LAB_0028aa27:
    if ((state->max_peerlist_size != 0) &&
       (ppptVar5 = (this->m_peers).
                   super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   .
                   super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node,
       state->max_peerlist_size <=
       (int)((int)((ulong)((long)(this->m_peers).
                                 super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                 .
                                 super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                 ._M_impl.super__Deque_impl_data._M_start._M_last -
                          (long)(this->m_peers).
                                super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                .
                                super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) +
             (int)((ulong)((long)(this->m_peers).
                                 super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                 .
                                 super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                 ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                          (long)(this->m_peers).
                                super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                .
                                super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) +
            ((((uint)((int)ppptVar5 -
                     *(int *)&(this->m_peers).
                              super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                              .
                              super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
            (uint)(ppptVar5 == (_Map_pointer)0x0)) * 0x40))) {
      erase_peers(this,state,(erase_peer_flags_t)0x2);
      peVar6 = (error_category *)
               (this->m_peers).
               super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               .
               super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node;
      peVar7 = (error_category *)
               (this->m_peers).
               super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               .
               super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node;
      piVar19 = (ipv6_peer *)
                (this->m_peers).
                super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                .
                super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      auVar8 = (uchar  [8])
               (this->m_peers).
               super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               .
               super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_first;
      pptVar26 = (this->m_peers).
                 super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 .
                 super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
      pptVar9 = (this->m_peers).
                super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                .
                super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                ._M_impl.super__Deque_impl_data._M_start._M_last;
      local_140 = state;
      if (state->max_peerlist_size <=
          (int)((int)((ulong)((long)pptVar9 - (long)pptVar26) >> 3) +
                (int)((ulong)((long)piVar19 - (long)auVar8) >> 3) +
               ((((uint)((int)peVar6 - (int)peVar7) >> 3) - 1) +
               (uint)(peVar6 == (error_category *)0x0)) * 0x40)) {
        local_f8 = (undefined1  [16])errors::make_error_code(too_many_connections);
        (*c->_vptr_peer_connection_interface[4])(c,local_f8,1,0);
        goto LAB_0028b413;
      }
      local_158 = (uchar  [8])
                  (this->m_peers).
                  super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                  .
                  super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_first;
      local_150 = (this->m_peers).
                  super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                  .
                  super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_last;
      local_148 = auVar8;
      iVar15 = (*c->_vptr_peer_connection_interface[2])(c);
      psVar17 = (short *)CONCAT44(extraout_var_03,iVar15);
      if (*psVar17 == 2) {
        local_b8 = (ulong)*(uint *)(psVar17 + 2) << 0x20;
        local_b0 = (undefined1  [16])0x0;
        local_a0 = 0;
      }
      else {
        local_b0 = *(undefined1 (*) [16])(psVar17 + 4);
        local_a0 = (ulong)*(uint *)(psVar17 + 0xc);
        local_b8 = 1;
      }
      local_f8[8] = local_158[0];
      local_f8[9] = local_158[1];
      local_f8[10] = local_158[2];
      local_f8[0xb] = local_158[3];
      local_f8[0xc] = local_158[4];
      local_f8[0xd] = local_158[5];
      local_f8[0xe] = local_158[6];
      local_f8[0xf] = local_158[7];
      local_f8._0_8_ = pptVar26;
      auStack_170._8_8_ = local_150;
      auStack_170[0] = local_148[0];
      auStack_170[1] = local_148[1];
      auStack_170[2] = local_148[2];
      auStack_170[3] = local_148[3];
      auStack_170[4] = local_148[4];
      auStack_170[5] = local_148[5];
      auStack_170[6] = local_148[6];
      auStack_170[7] = local_148[7];
      local_178 = (undefined1  [8])piVar19;
      peStack_160 = peVar6;
      local_e8._M_allocated_capacity = (size_type)pptVar9;
      local_e8._8_8_ = peVar7;
      ::std::
      __lower_bound<std::_Deque_iterator<libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_peer*&,libtorrent::aux::torrent_peer**>,boost::asio::ip::address,__gnu_cxx::__ops::_Iter_comp_val<libtorrent::aux::peer_address_compare>>
                (local_118);
      local_180 = (_Elt_pointer)local_118._16_8_;
      ptVar24 = (torrent_state *)local_118._8_8_;
      state = local_140;
    }
    if (local_138._M_string_length != 0) {
      sVar30._M_str = local_138._M_dataplus._M_p;
      sVar30._M_len = local_138._M_string_length;
      this_00 = add_i2p_peer(this,sVar30,(peer_source_flags_t)0x20,(pex_flags_t)0x0,state);
      goto LAB_0028ac8d;
    }
    local_140 = ptVar24;
    iVar15 = (*c->_vptr_peer_connection_interface[2])(c);
    sVar1 = *(short *)CONCAT44(extraout_var_04,iVar15);
    iVar15 = (**this->m_peer_allocator->_vptr_torrent_peer_allocator_interface)
                       (this->m_peer_allocator,(ulong)(sVar1 != 2));
    piVar19 = (ipv6_peer *)CONCAT44(extraout_var_05,iVar15);
    local_178 = (undefined1  [8])piVar19;
    if (piVar19 == (ipv6_peer *)0x0) {
      this_00 = (torrent_peer *)0x0;
    }
    else {
      if (sVar1 == 2) {
        iVar15 = (*c->_vptr_peer_connection_interface[2])(c);
        ipv4_peer::ipv4_peer
                  ((ipv4_peer *)piVar19,(endpoint *)CONCAT44(extraout_var_07,iVar15),false,
                   (peer_source_flags_t)0x0);
      }
      else {
        iVar15 = (*c->_vptr_peer_connection_interface[2])(c);
        ipv6_peer::ipv6_peer
                  (piVar19,(endpoint *)CONCAT44(extraout_var_06,iVar15),false,
                   (peer_source_flags_t)0x0);
      }
      local_90._M_first = (_Elt_pointer)local_140;
      local_90._M_last = local_180;
      local_178 = (undefined1  [8])piVar19;
      ::std::
      deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::
      insert((iterator *)local_f8,
             (deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
              *)this,&local_90,(value_type *)local_178);
      if ((long)(((long)(this->m_peers).
                        super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                        .
                        super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_last -
                  (long)(this->m_peers).
                        super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                        .
                        super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
                 ((long)(local_f8._0_8_ - local_f8._8_8_) >> 3) +
                ((((ulong)(local_e8._8_8_ -
                          (long)(this->m_peers).
                                super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                .
                                super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                (ulong)((error_category *)local_e8._8_8_ == (error_category *)0x0)) * 0x40) <=
          (long)this->m_round_robin) {
        this->m_round_robin = this->m_round_robin + 1;
      }
      this_00 = *(torrent_peer **)local_f8._0_8_;
      *(uint *)&this_00->field_0x1b = *(uint *)&this_00->field_0x1b & 0xff81ffff | 0x400000;
    }
    if (piVar19 == (ipv6_peer *)0x0) goto LAB_0028b413;
  }
  (*c->_vptr_peer_connection_interface[9])(c,this_00);
  (*c->_vptr_peer_connection_interface[0xb])
            (c,(ulong)this_00->prev_amount_download << 10,(ulong)this_00->prev_amount_upload << 10);
  this_00->prev_amount_upload = 0;
  this_00->prev_amount_download = 0;
  this_00->connection = c;
  iVar15 = (*c->_vptr_peer_connection_interface[0xc])(c);
  bVar28 = true;
  if ((char)iVar15 == '\0') {
    this_00->last_connected = (uint16_t)local_94;
  }
LAB_0028b415:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  return bVar28;
}

Assistant:

bool peer_list::new_connection(peer_connection_interface& c, int session_time
		, torrent_state* state)
	{
		TORRENT_ASSERT(is_single_thread());
//		TORRENT_ASSERT(!c.is_outgoing());

		INVARIANT_CHECK;

		iterator iter;
		torrent_peer* i = nullptr;

#if TORRENT_USE_I2P
		std::string const i2p_dest = c.destination();
#else
		std::string const i2p_dest;
#endif

		bool found = false;
		// this check doesn't support i2p peers
		if (state->allow_multiple_connections_per_ip && i2p_dest.empty())
		{
			auto const& remote = c.remote();
			auto const addr = remote.address();
			auto const range = find_peers(addr);
			iter = std::find_if(range.first, range.second, match_peer_endpoint(addr, remote.port()));

			if (iter != range.second)
			{
				TORRENT_ASSERT((*iter)->in_use);
				found = true;
			}
		}
		else
		{
#if TORRENT_USE_I2P
			if (!i2p_dest.empty())
			{
				iter = std::lower_bound(
					m_peers.begin(), m_peers.end()
					, i2p_dest, peer_address_compare()
					);

				if (iter != m_peers.end() && (*iter)->is_i2p_addr && (*iter)->dest() == i2p_dest)
				{
					TORRENT_ASSERT((*iter)->in_use);
					found = true;
				}
			}
			else
#endif
			{
				iter = std::lower_bound(
					m_peers.begin(), m_peers.end()
					, c.remote().address(), peer_address_compare()
					);

				if (iter != m_peers.end() && (*iter)->address() == c.remote().address())
				{
					TORRENT_ASSERT((*iter)->in_use);
					found = true;
				}
			}
		}

		// make sure the iterator we got is properly sorted relative
		// to the connection's address
//		TORRENT_ASSERT(m_peers.empty()
//			|| (iter == m_peers.end() && (*(iter-1))->address() < c.remote().address())
//			|| (iter != m_peers.end() && c.remote().address() < (*iter)->address())
//			|| (iter != m_peers.end() && iter != m_peers.begin() && (*(iter-1))->address() < c.remote().address()));

		if (found)
		{
			i = *iter;
			TORRENT_ASSERT(i->in_use);
			TORRENT_ASSERT(i->connection != &c);
			TORRENT_ASSERT(i->address() == c.remote().address());

#ifndef TORRENT_DISABLE_LOGGING
			if (i->connection != nullptr && c.should_log(peer_log_alert::info))
			{
#if TORRENT_USE_I2P
				if (!i2p_dest.empty())
				{
					c.peer_log(peer_log_alert::info, "DUPLICATE PEER", "destination: \"%s\""
						, i2p_dest.c_str());
				}
				else
#endif
				{
					c.peer_log(peer_log_alert::info, "DUPLICATE PEER", "this: \"%s\" that: \"%s\""
						, print_address(c.remote().address()).c_str()
						, print_address(i->address()).c_str());
				}
			}
#endif
			if (i->banned)
			{
				c.disconnect(errors::peer_banned, operation_t::bittorrent);
				return false;
			}

			if (i->connection != nullptr)
			{
				bool self_connection = false;
#if TORRENT_USE_I2P
				if (!i2p_dest.empty())
				{
					self_connection = i->connection->local_i2p_endpoint() == i2p_dest;
				}
				else
#endif
				{
					self_connection = i->connection->remote() == c.local_endpoint()
					|| i->connection->local_endpoint() == c.remote();
				}

				if (self_connection)
				{
					c.disconnect(errors::self_connection, operation_t::bittorrent, peer_connection_interface::failure);
					TORRENT_ASSERT(i->connection->peer_info_struct() == i);
					i->connection->disconnect(errors::self_connection, operation_t::bittorrent, peer_connection_interface::failure);
					TORRENT_ASSERT(i->connection == nullptr);
					return false;
				}

				TORRENT_ASSERT(i->connection != &c);
				// the new connection is a local (outgoing) connection
				// or the current one is already connected
				if (i->connection->is_outgoing() == c.is_outgoing())
				{
					// if the other end connected to us both times, just drop
					// the second one. Or if we made both connections.
					c.disconnect(errors::duplicate_peer_id, operation_t::bittorrent);
					return false;
				}
#if TORRENT_USE_I2P
				else if (!i2p_dest.empty())
				{
					// duplicate connection resolution for i2p connections is
					// simple. The smaller address takes priority for making the
					// outgoing connection

					std::string const& other_dest = i->connection->destination();

					// decide which peer connection to disconnect
					// if the ports are equal, pick on at random
					bool disconnect1 = c.is_outgoing() && i2p_dest > other_dest;

#ifndef TORRENT_DISABLE_LOGGING
					if (c.should_log(peer_log_alert::info))
					{
						c.peer_log(peer_log_alert::info, "DUPLICATE_PEER_RESOLUTION"
							, "our: %s other: %s disconnecting: %s"
							, i2p_dest.c_str(), other_dest.c_str(), disconnect1 ? "yes" : "no");
						i->connection->peer_log(peer_log_alert::info, "DUPLICATE_PEER_RESOLUTION"
							, "our: %s other: %s disconnecting: %s"
							, other_dest.c_str(), i2p_dest.c_str(), disconnect1 ? "no" : "yes");
					}
#endif

					if (disconnect1)
					{
						c.disconnect(errors::duplicate_peer_id, operation_t::bittorrent);
						return false;
					}
					TORRENT_ASSERT(m_locked_peer == nullptr);
					m_locked_peer = i;
					i->connection->disconnect(errors::duplicate_peer_id, operation_t::bittorrent);
					m_locked_peer = nullptr;
				}
#endif
				else
				{
					// at this point, we need to disconnect either
					// i->connection or c. In order for both this client
					// and the client on the other end to decide to
					// disconnect the same one, we need a consistent rule to
					// select which one.

					bool const outgoing1 = c.is_outgoing();

					// for this, we compare our ports and whoever has the lower port
					// should be the one keeping its outgoing connection. Since
					// outgoing ports are selected at random by the OS, we need to
					// be careful to only look at the target end of a connection for
					// the endpoint.

					int const our_port = outgoing1 ? i->connection->local_endpoint().port() : c.local_endpoint().port();
					int const other_port = outgoing1 ? c.remote().port() : i->connection->remote().port();

					// decide which peer connection to disconnect
					// if the ports are equal, pick on at random
					bool disconnect1 = ((our_port < other_port) && !outgoing1)
						|| ((our_port > other_port) && outgoing1)
						|| ((our_port == other_port) && random(1));
					disconnect1 &= !i->connection->failed();

#ifndef TORRENT_DISABLE_LOGGING
					if (c.should_log(peer_log_alert::info))
					{
						c.peer_log(peer_log_alert::info, "DUPLICATE_PEER_RESOLUTION"
							, "our: %d other: %d disconnecting: %s"
							, our_port, other_port, disconnect1 ? "yes" : "no");
						i->connection->peer_log(peer_log_alert::info, "DUPLICATE_PEER_RESOLUTION"
							, "our: %d other: %d disconnecting: %s"
							, our_port, other_port, disconnect1 ? "no" : "yes");
					}
#endif

					if (disconnect1)
					{
						c.disconnect(errors::duplicate_peer_id, operation_t::bittorrent);
						return false;
					}
					TORRENT_ASSERT(m_locked_peer == nullptr);
					m_locked_peer = i;
					i->connection->disconnect(errors::duplicate_peer_id, operation_t::bittorrent);
					m_locked_peer = nullptr;
				}
			}

			if (is_connect_candidate(*i))
				update_connect_candidates(-1);
		}